

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v10::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int local_50;
  
  uVar3 = lhs1->exp_;
  iVar13 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + uVar3;
  uVar4 = lhs2->exp_;
  iVar14 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + uVar4;
  iVar2 = iVar14;
  if (iVar14 < iVar13) {
    iVar2 = iVar13;
  }
  iVar15 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  uVar5 = rhs->exp_;
  iVar1 = uVar5 + iVar15;
  iVar8 = -1;
  if ((iVar1 <= iVar2 + 1) && (iVar8 = 1, iVar2 <= iVar1)) {
    uVar16 = uVar4;
    if ((int)uVar3 < (int)uVar4) {
      uVar16 = uVar3;
    }
    if ((int)uVar5 <= (int)uVar16) {
      uVar16 = uVar5;
    }
    uVar17 = 0;
    do {
      iVar2 = uVar5 + iVar15;
      uVar12 = uVar17;
      if (iVar2 <= (int)uVar16) break;
      if (iVar13 < iVar2 || iVar2 <= (int)uVar3) {
        uVar9 = 0;
      }
      else {
        uVar7 = ~uVar3 + uVar5 + iVar15;
        if ((int)uVar7 < 0) goto LAB_001797cf;
        uVar9 = (ulong)(lhs1->bigits_).super_buffer<unsigned_int>.ptr_[uVar7];
      }
      if (iVar14 < iVar2 || iVar2 <= (int)uVar4) {
        uVar10 = 0;
      }
      else {
        uVar7 = ~uVar4 + uVar5 + iVar15;
        if ((int)uVar7 < 0) goto LAB_001797cf;
        uVar10 = (ulong)(lhs2->bigits_).super_buffer<unsigned_int>.ptr_[uVar7];
      }
      if (iVar1 < iVar2 || iVar2 <= (int)uVar5) {
        uVar11 = 0;
      }
      else {
        if ((int)(iVar15 - 1U) < 0) {
LAB_001797cf:
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
                      ,0x17a,"negative value");
        }
        uVar11 = (ulong)(rhs->bigits_).super_buffer<unsigned_int>.ptr_[iVar15 - 1U];
      }
      uVar12 = (uVar11 + uVar17) - (uVar10 + uVar9);
      if (uVar11 + uVar17 < uVar10 + uVar9) {
        local_50 = 1;
        bVar6 = false;
        uVar12 = uVar17;
      }
      else {
        bVar6 = uVar12 < 2;
        if (bVar6) {
          uVar12 = uVar12 << 0x20;
        }
        else {
          local_50 = -1;
        }
      }
      iVar15 = iVar15 + -1;
      uVar17 = uVar12;
    } while (bVar6);
    iVar8 = -(uint)(uVar12 != 0);
    if ((int)uVar16 < iVar2) {
      iVar8 = local_50;
    }
  }
  return iVar8;
}

Assistant:

FMT_CONSTEXPR20 int num_bigits() const {
    return static_cast<int>(bigits_.size()) + exp_;
  }